

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRFromMemory(float **out_rgba,int *width,int *height,uchar *memory,size_t size,char **err)

{
  uchar *puVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  uchar *puVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  ostream *poVar10;
  float *pfVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  float *pfVar17;
  char *pcVar18;
  long lVar19;
  EXRTile *pEVar20;
  size_t jj_1;
  size_t jj;
  EXRChannelInfo *__s1;
  ulong uVar21;
  size_t pixel_size;
  long lVar22;
  long lVar23;
  float fVar24;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader exr_header;
  stringstream ss;
  long local_408;
  int local_400;
  float *local_3f8;
  int local_3f0;
  long local_3e0;
  EXRImage local_3d8;
  EXRTile *local_3a0;
  long local_398;
  int *local_390;
  int *local_388;
  long local_380;
  EXRVersion local_374;
  char *local_360;
  char local_350 [16];
  int *local_340 [2];
  int local_330 [10];
  int local_308;
  int local_304;
  int local_300;
  EXRChannelInfo *local_2d8;
  int *local_2d0;
  int local_2c8;
  int *local_2c0;
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (out_rgba == (float **)0x0 || memory == (uchar *)0x0) {
    piVar5 = (int *)((long)&((EXRHeader *)local_340)->data_window + 8);
    local_340[0] = piVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_340,"Invalid argument for LoadEXRFromMemory","");
    if (err != (char **)0x0) {
      pcVar9 = strdup((char *)local_340[0]);
      *err = pcVar9;
    }
    if (local_340[0] != piVar5) {
      operator_delete(local_340[0]);
    }
    return -3;
  }
  local_388 = width;
  memset((EXRHeader *)local_340,0,0x188);
  iVar6 = ParseEXRVersionFromMemory(&local_374,memory,size);
  if (iVar6 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Failed to parse EXR version. code(",0x22);
    poVar10 = (ostream *)std::ostream::operator<<(local_1a8,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar9 = strdup(local_360);
      *err = pcVar9;
    }
    if (local_360 != local_350) {
      operator_delete(local_360);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    return iVar6;
  }
  iVar6 = ParseEXRHeaderFromMemory((EXRHeader *)local_340,&local_374,memory,size,err);
  if (iVar6 != 0) {
    return iVar6;
  }
  if (0 < local_2c8) {
    lVar12 = 0;
    do {
      if (local_2d0[lVar12] == 1) {
        local_2c0[lVar12] = 2;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < local_2c8);
  }
  local_3d8.width = 0;
  local_3d8.height = 0;
  local_3d8.num_channels = 0;
  local_3d8.num_tiles = 0;
  local_3d8.level_x = 0;
  local_3d8.level_y = 0;
  local_3d8.images = (uchar **)0x0;
  local_3d8.tiles = (EXRTile *)0x0;
  local_3d8.next_level = (TEXRImage *)0x0;
  iVar6 = LoadEXRImageFromMemory(&local_3d8,(EXRHeader *)local_340,memory,size,err);
  if (iVar6 != 0) {
    return iVar6;
  }
  local_390 = height;
  if ((long)local_2c8 < 1) {
    local_408._0_4_ = -1;
    local_3f0 = -1;
    local_400 = -1;
    iVar6 = -1;
  }
  else {
    uVar14 = 0xffffffff;
    uVar16 = 0;
    local_400 = -1;
    local_3f0 = -1;
    local_408._0_4_ = -1;
    __s1 = local_2d8;
    do {
      iVar7 = strcmp(__s1->name,"R");
      iVar15 = (int)uVar16;
      iVar6 = local_3f0;
      if (iVar7 == 0) {
        uVar14 = uVar16 & 0xffffffff;
        iVar7 = local_400;
      }
      else {
        iVar8 = strcmp(__s1->name,"G");
        iVar7 = iVar15;
        if (((iVar8 != 0) &&
            (iVar8 = strcmp(__s1->name,"B"), iVar7 = local_400, iVar6 = iVar15, iVar8 != 0)) &&
           (iVar8 = strcmp(__s1->name,"A"), iVar6 = local_3f0, iVar8 == 0)) {
          local_408._0_4_ = iVar15;
        }
      }
      local_3f0 = iVar6;
      local_400 = iVar7;
      iVar6 = (int)uVar14;
      uVar16 = uVar16 + 1;
      __s1 = __s1 + 1;
    } while ((long)local_2c8 != uVar16);
  }
  if (local_2c8 == 1) {
    uVar14 = (ulong)local_3d8.width;
    lVar12 = (long)local_3d8.height * uVar14;
    pfVar11 = (float *)malloc(lVar12 * 0x10);
    *out_rgba = pfVar11;
    if (local_308 == 0) {
      if (lVar12 != 0) {
        puVar1 = *local_3d8.images;
        pfVar11 = pfVar11 + 3;
        lVar19 = 0;
        do {
          fVar24 = *(float *)(puVar1 + lVar19 * 4);
          pfVar11[-3] = fVar24;
          pfVar11[-2] = fVar24;
          pfVar11[-1] = fVar24;
          *pfVar11 = fVar24;
          lVar19 = lVar19 + 1;
          pfVar11 = pfVar11 + 4;
        } while (lVar12 - lVar19 != 0);
      }
    }
    else if (0 < (long)local_3d8.num_tiles) {
      lVar12 = (long)local_304;
      local_408 = 0;
      do {
        if (local_300 != 0) {
          pEVar20 = local_3d8.tiles + local_408;
          lVar19 = 0;
          lVar23 = 0;
          do {
            if (local_304 != 0) {
              uVar16 = pEVar20->offset_x * lVar12;
              uVar21 = (long)pEVar20->offset_y * (long)local_300 + lVar23;
              pfVar17 = pfVar11 + (uVar14 * uVar21 + uVar16) * 4 + 3;
              lVar13 = lVar12;
              lVar22 = lVar19;
              do {
                if ((uVar16 < uVar14) && (uVar21 < (ulong)(long)local_3d8.height)) {
                  puVar1 = *pEVar20->images;
                  pfVar17[-3] = *(float *)(puVar1 + lVar22);
                  pfVar17[-2] = *(float *)(puVar1 + lVar22);
                  pfVar17[-1] = *(float *)(puVar1 + lVar22);
                  *pfVar17 = *(float *)(puVar1 + lVar22);
                }
                pfVar17 = pfVar17 + 4;
                uVar16 = uVar16 + 1;
                lVar22 = lVar22 + 4;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
            }
            lVar23 = lVar23 + 1;
            lVar19 = lVar19 + lVar12 * 4;
          } while (lVar23 != local_300);
        }
        local_408 = local_408 + 1;
      } while (local_408 != local_3d8.num_tiles);
    }
LAB_00106a9f:
    *local_388 = local_3d8.width;
    *local_390 = local_3d8.height;
    FreeEXRHeader((EXRHeader *)local_340);
    FreeEXRImage(&local_3d8);
    iVar6 = 0;
  }
  else {
    if (iVar6 == -1) {
      pcVar18 = "R channel not found";
      pcVar9 = "";
    }
    else if (local_400 == -1) {
      pcVar18 = "G channel not found";
      pcVar9 = "";
    }
    else {
      if (local_3f0 != -1) {
        uVar14 = (ulong)local_3d8.width;
        lVar12 = (long)local_3d8.height * uVar14;
        local_3f8 = (float *)malloc(lVar12 * 0x10);
        *out_rgba = local_3f8;
        if (local_308 == 0) {
          if (lVar12 != 0) {
            puVar1 = local_3d8.images[iVar6];
            puVar3 = local_3d8.images[local_400];
            puVar4 = local_3d8.images[local_3f0];
            local_3f8 = local_3f8 + 3;
            lVar19 = 0;
            do {
              local_3f8[-3] = *(float *)(puVar1 + lVar19 * 4);
              local_3f8[-2] = *(float *)(puVar3 + lVar19 * 4);
              local_3f8[-1] = *(float *)(puVar4 + lVar19 * 4);
              fVar24 = 1.0;
              if ((int)local_408 != -1) {
                fVar24 = *(float *)(local_3d8.images[(int)local_408] + lVar19 * 4);
              }
              *local_3f8 = fVar24;
              lVar19 = lVar19 + 1;
              local_3f8 = local_3f8 + 4;
            } while (lVar12 - lVar19 != 0);
          }
        }
        else {
          local_398 = (long)local_3d8.num_tiles;
          if (0 < local_398) {
            lVar12 = (long)local_304;
            local_3a0 = local_3d8.tiles;
            local_380 = lVar12 * 4;
            local_3e0 = 0;
            do {
              if (local_300 != 0) {
                pEVar20 = local_3d8.tiles + local_3e0;
                lVar23 = 0;
                lVar19 = 0;
                do {
                  if (local_304 != 0) {
                    uVar21 = pEVar20->offset_x * lVar12;
                    uVar16 = (long)pEVar20->offset_y * (long)local_300 + lVar19;
                    pfVar11 = local_3f8 + (uVar14 * uVar16 + uVar21) * 4 + 3;
                    lVar13 = lVar12;
                    lVar22 = lVar23;
                    do {
                      if ((uVar21 < uVar14) && (uVar16 < (ulong)(long)local_3d8.height)) {
                        ppuVar2 = pEVar20->images;
                        pfVar11[-3] = *(float *)(ppuVar2[iVar6] + lVar22);
                        pfVar11[-2] = *(float *)(ppuVar2[local_400] + lVar22);
                        pfVar11[-1] = *(float *)(ppuVar2[local_3f0] + lVar22);
                        fVar24 = 1.0;
                        if ((int)local_408 != -1) {
                          fVar24 = *(float *)(ppuVar2[(int)local_408] + lVar22);
                        }
                        *pfVar11 = fVar24;
                      }
                      lVar22 = lVar22 + 4;
                      pfVar11 = pfVar11 + 4;
                      uVar21 = uVar21 + 1;
                      lVar13 = lVar13 + -1;
                    } while (lVar13 != 0);
                  }
                  lVar19 = lVar19 + 1;
                  lVar23 = lVar23 + local_380;
                } while (lVar19 != local_300);
              }
              local_3e0 = local_3e0 + 1;
            } while (local_3e0 != local_398);
          }
        }
        goto LAB_00106a9f;
      }
      pcVar18 = "B channel not found";
      pcVar9 = "";
    }
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pcVar18,pcVar9);
    if (err != (char **)0x0) {
      pcVar9 = strdup((char *)local_1b8[0]);
      *err = pcVar9;
    }
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
    iVar6 = -4;
  }
  return iVar6;
}

Assistant:

int LoadEXRFromMemory(float **out_rgba, int *width, int *height,
                      const unsigned char *memory, size_t size,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory, size);
  if (ret != TINYEXR_SUCCESS) {
    std::stringstream ss;
    ss << "Failed to parse EXR version. code(" << ret << ")";
    tinyexr::SetErrorMessage(ss.str(), err);
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  // TODO(syoyo): Refactor removing same code as used in LoadEXR().
  if (exr_header.num_channels == 1) {
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[0][srcIdx];
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        const float val = reinterpret_cast<float **>(exr_image.images)[0][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }

  } else {
    // TODO(syoyo): Support non RGBA image.

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++)
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}